

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsGramNode * __thiscall CTcParser::flatten_gram_rule(CTcParser *this,int *err)

{
  int iVar1;
  CTcPrsGramNode *pCVar2;
  undefined4 extraout_var;
  int *in_RSI;
  int *in_RDI;
  CTcPrsGramNodeOr *new_or;
  CTcPrsGramNode *tree;
  CTcPrsMem *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  CTcParser *in_stack_fffffffffffffff8;
  CTcPrsGramNodeOr *this_01;
  CTcPrsGramNodeOr *this_00;
  
  pCVar2 = parse_gram_or(in_stack_fffffffffffffff8,in_RDI,(int)((ulong)in_RSI >> 0x20));
  if ((pCVar2 == (CTcPrsGramNode *)0x0) || (*in_RSI != 0)) {
    this_01 = (CTcPrsGramNodeOr *)0x0;
  }
  else {
    iVar1 = (*(pCVar2->super_CTcTokenSource)._vptr_CTcTokenSource[3])();
    this_00 = (CTcPrsGramNodeOr *)CONCAT44(extraout_var,iVar1);
    (*(this_00->super_CTcPrsGramNodeWithChildren).super_CTcPrsGramNode.super_CTcTokenSource.
      _vptr_CTcTokenSource[4])();
    iVar1 = (*(this_00->super_CTcPrsGramNodeWithChildren).super_CTcPrsGramNode.super_CTcTokenSource.
              _vptr_CTcTokenSource[5])();
    this_01 = this_00;
    if (iVar1 == 0) {
      this_01 = (CTcPrsGramNodeOr *)
                operator_new(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      memset(this_01,0,0x88);
      CTcPrsGramNodeOr::CTcPrsGramNodeOr(this_00);
      CTcPrsGramNodeWithChildren::add_sub_item
                (&this_01->super_CTcPrsGramNodeWithChildren,(CTcPrsGramNode *)this_00);
    }
    (*(this_01->super_CTcPrsGramNodeWithChildren).super_CTcPrsGramNode.super_CTcTokenSource.
      _vptr_CTcTokenSource[8])();
  }
  return (CTcPrsGramNode *)this_01;
}

Assistant:

CTcPrsGramNode *CTcParser::flatten_gram_rule(int *err)
{
    /* first, build the top-level 'or' tree */
    CTcPrsGramNode *tree = parse_gram_or(err, 0);
    if (tree == 0 || *err != 0)
        return 0;

    /* move all of the OR's to a single OR at the top of the tree */
    tree = tree->consolidate_or();

    /* flatten CAT nodes in the resulting tree */
    tree->flatten_cat();

    /* 
     *   if the top-level node isn't an OR, insert an OR at the top - this
     *   makes the tree always follow the same shape, which makes it easier
     *   to step through the tokens in the expansion
     */
    if (!tree->is_or())
    {
        CTcPrsGramNodeOr *new_or;

        /* create an OR node for the root of the tree */
        new_or = new (G_prsmem) CTcPrsGramNodeOr();

        /* insert our old root as the single alternative under the OR */
        new_or->add_sub_item(tree);

        /* the OR is now the root of the tree */
        tree = new_or;
    }

    /* start reading from the first token in the tree */
    tree->init_expansion();

    /* return the tree */
    return tree;
}